

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O1

JavascriptArray * __thiscall
JsrtDebugStackFrames::StackFrames(JsrtDebugStackFrames *this,ScriptContext *scriptContext)

{
  int iVar1;
  int iVar2;
  uint32 length;
  ThreadContext *pTVar3;
  void *context;
  ScriptContext *this_00;
  ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer> *this_01;
  DiagStackFrame *pDVar4;
  code *pcVar5;
  bool bVar6;
  BaseDictionary<unsigned_int,_JsrtDebuggerStackFrame_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_02;
  ArenaAllocator *pAVar7;
  List<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_03;
  DebugContext *pDVar8;
  WeakDiagStack *obj;
  DiagStackFrame **ppDVar9;
  JavascriptArray *pJVar10;
  undefined4 *puVar11;
  DynamicObject *value;
  Var newValue;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_04;
  int iVar12;
  long lVar13;
  size_t nmemb;
  
  pTVar3 = scriptContext->threadContext;
  context = pTVar3->debugManager->dispatchHaltFrameAddress;
  if (context != (void *)0x0) {
    if (this->framesDictionary == (FramesDictionary *)0x0) {
      pAVar7 = JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager);
      this_02 = (BaseDictionary<unsigned_int,_JsrtDebuggerStackFrame_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)new<Memory::ArenaAllocator>(0x38,pAVar7,0x366bee);
      pAVar7 = JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager);
      JsUtil::
      BaseDictionary<unsigned_int,_JsrtDebuggerStackFrame_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::BaseDictionary(this_02,pAVar7,10);
      this->framesDictionary = this_02;
    }
    else {
      ClearFrameDictionary(this);
    }
    pAVar7 = JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager);
    this_03 = (List<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *)new<Memory::ArenaAllocator>(0x30,pAVar7,0x366bee);
    pAVar7 = JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager);
    (this_03->super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).
    buffer = (Type)0x0;
    (this_03->super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).
    count = 0;
    (this_03->super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).
    alloc = pAVar7;
    (this_03->super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).
    _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014e51f0;
    this_03->length = 0;
    this_03->increment = 10;
    this_00 = pTVar3->scriptContextList;
    while ((this_00 != (ScriptContext *)0x0 &&
           (bVar6 = Js::ScriptContext::IsScriptContextInDebugMode(this_00), bVar6))) {
      pDVar8 = Js::ScriptContext::GetDebugContext(this_00);
      obj = Js::ProbeContainer::GetFramePointers(pDVar8->diagProbesContainer,(DWORD_PTR)context);
      if (obj != (WeakDiagStack *)0x0) {
        bVar6 = Memory::ReferencedArenaAdapter::AddStrongReference(obj->adapter);
        this_01 = (ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer> *)
                  obj->p;
        if ((this_01 !=
             (ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer> *)0x0 &&
             bVar6) && (iVar1 = this_01->count, 0 < iVar1)) {
          iVar12 = -1;
          do {
            ppDVar9 = JsUtil::
                      ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>::
                      Item(this_01,this_01->count + iVar12);
            pDVar4 = *ppDVar9;
            JsUtil::
            List<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::EnsureArray(this_03,0);
            iVar2 = (this_03->
                    super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>
                    ).count;
            (this_03->
            super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).
            buffer[iVar2] = pDVar4;
            (this_03->
            super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).count
                 = iVar2 + 1;
            iVar2 = iVar1 + iVar12;
            iVar12 = iVar12 + -1;
          } while (iVar2 != 0);
        }
        Memory::ReferencedArenaAdapter::ReleaseStrongReference(obj->adapter);
        Memory::
        DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::WeakArenaReference<JsUtil::Stack<Js::DiagStackFrame*,Memory::ArenaAllocator,false,DefaultComparer>>>
                  (&Memory::HeapAllocator::Instance,obj);
      }
      this_00 = this_00->next;
    }
    nmemb = (size_t)(this_03->
                    super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>
                    ).count;
    if (nmemb != 0) {
      JsUtil::
      QuickSort<Memory::_no_write_barrier_policy,_char,_int_(*)(void_*,_const_void_*,_const_void_*)>
      ::Sort((char *)(this_03->
                     super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>
                     ).buffer,nmemb,8,DiagStackFrameSorter,context);
    }
    length = (this_03->
             super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).
             count;
    pJVar10 = Js::JavascriptLibrary::CreateArray
                        ((scriptContext->super_ScriptContextBase).javascriptLibrary,length,length);
    if (0 < (this_03->
            super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).count
       ) {
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      lVar13 = 0;
      do {
        pDVar4 = (this_03->
                 super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).
                 buffer[lVar13];
        if ((lVar13 == 0) && (bVar6 = Js::DiagStackFrame::IsTopFrame(pDVar4), !bVar6)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebuggerObject.cpp"
                             ,0x399,"(index != 0 || stackFrame->IsTopFrame())",
                             "Index 0 frame is not marked as top frame");
          if (!bVar6) goto LAB_003af065;
          *puVar11 = 0;
        }
        value = GetStackFrame(this,pDVar4,(uint)lVar13);
        newValue = Js::CrossSite::MarshalVar(scriptContext,value,false);
        Js::JavascriptArray::DirectSetItemAt<void*>(pJVar10,(uint)lVar13,newValue);
        lVar13 = lVar13 + 1;
      } while (lVar13 < (this_03->
                        super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>
                        ).count);
    }
    this_04 = &JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager)->
               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    (*(this_03->super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).
      _vptr_ReadOnlyList[2])(this_03);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (this_04,this_03,0x30);
    return pJVar10;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar11 = 1;
  bVar6 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebuggerObject.cpp"
                     ,0x36a,"(dispatchHaltFrameAddress > 0)",
                     "Didn\'t set the dispatchHaltFrameAddress at time of break?");
  if (bVar6) {
    *puVar11 = 0;
    pJVar10 = Js::JavascriptLibrary::CreateArray
                        ((scriptContext->super_ScriptContextBase).javascriptLibrary,0,0);
    return pJVar10;
  }
LAB_003af065:
  pcVar5 = (code *)invalidInstructionException();
  (*pcVar5)();
}

Assistant:

Js::JavascriptArray * JsrtDebugStackFrames::StackFrames(Js::ScriptContext * scriptContext)
{
    Js::JavascriptArray* stackTraceArray = nullptr;

    ThreadContext* threadContext = scriptContext->GetThreadContext();

    DWORD_PTR dispatchHaltFrameAddress = threadContext->GetDebugManager()->GetDispatchHaltFrameAddress();
    AssertMsg(dispatchHaltFrameAddress > 0, "Didn't set the dispatchHaltFrameAddress at time of break?");

    if (dispatchHaltFrameAddress != 0)
    {
        if (this->framesDictionary == nullptr)
        {
            this->framesDictionary = Anew(this->jsrtDebugManager->GetDebugObjectArena(), FramesDictionary, this->jsrtDebugManager->GetDebugObjectArena(), 10);
        }
        else
        {
            this->ClearFrameDictionary();
        }

        typedef JsUtil::List<Js::DiagStackFrame*, ArenaAllocator> DiagStackFrameList;
        DiagStackFrameList* stackList = Anew(this->jsrtDebugManager->GetDebugObjectArena(), DiagStackFrameList, this->jsrtDebugManager->GetDebugObjectArena(), 10);

        // Walk all the script contexts and collect the frames which are below the address when break was reported.
        for (Js::ScriptContext *tempScriptContext = threadContext->GetScriptContextList();
        tempScriptContext != nullptr && tempScriptContext->IsScriptContextInDebugMode();
            tempScriptContext = tempScriptContext->next)
        {
            Js::WeakDiagStack * framePointers = tempScriptContext->GetDebugContext()->GetProbeContainer()->GetFramePointers(dispatchHaltFrameAddress);
            if (framePointers != nullptr)
            {
                Js::DiagStack* stackFrames = framePointers->GetStrongReference();
                if (stackFrames != nullptr)
                {
                    int count = stackFrames->Count();
                    for (int frameIndex = 0; frameIndex < count; ++frameIndex)
                    {
                        Js::DiagStackFrame* stackFrame = stackFrames->Peek(frameIndex);
                        stackList->Add(stackFrame);
                    }
                }

                framePointers->ReleaseStrongReference();
                HeapDelete(framePointers);
            }
        }

        // Frames can be from multiple contexts, sort them based on stack address
        stackList->Sort(DiagStackFrameSorter, (void*)dispatchHaltFrameAddress);

        stackTraceArray = scriptContext->GetLibrary()->CreateArray(stackList->Count(), stackList->Count());

        stackList->Map([&](int index, Js::DiagStackFrame* stackFrame)
        {
            AssertMsg(index != 0 || stackFrame->IsTopFrame(), "Index 0 frame is not marked as top frame");
            Js::DynamicObject* stackTraceObject = this->GetStackFrame(stackFrame, index);
            Js::Var marshaledObj = Js::CrossSite::MarshalVar(scriptContext, stackTraceObject);
            stackTraceArray->DirectSetItemAt(index, marshaledObj);
        });

        Adelete(this->jsrtDebugManager->GetDebugObjectArena(), stackList);
    }
    else
    {
        // Empty array
        stackTraceArray = scriptContext->GetLibrary()->CreateArray(0, 0);
    }

    return stackTraceArray;
}